

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O2

void WasmCGenCompare(WasmCGen *cgen,PCSTR type,PCSTR cmp,PCSTR b)

{
  w3SourceGenStack *this;
  allocator<char> local_14a;
  allocator<char> local_149;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  printf("/*%s*/\n","WasmCGenCompare");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"(",&local_149);
  this = &(cgen->super_w3SourceGen).stack;
  w3SourceGenStack::pop_abi_cxx11_(&local_108,this);
  WasmCGenCast(&local_e8,type,&local_108);
  std::operator+(&local_a8,&local_c8,&local_e8);
  std::operator+(&local_88,&local_a8,cmp);
  if (b == (PCSTR)0x0) {
    w3SourceGenStack::pop_abi_cxx11_(&local_148,this);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,b,&local_14a);
  }
  WasmCGenCast(&local_128,type,&local_148);
  std::operator+(&local_68,&local_88,&local_128);
  std::operator+(&local_48,&local_68,")");
  w3SourceGen::push(&cgen->super_w3SourceGen,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

void WasmCGenCompare (WasmCGen* cgen, PCSTR type, PCSTR cmp, PCSTR b = 0)
{
    printf ("/*%s*/\n", __func__);
    cgen->push (string ("(") + WasmCGenCast (type, cgen->pop ()) + cmp + WasmCGenCast (type, b ? b : cgen->pop ()) + ")");
}